

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

CappedArray<char,_26UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_26UL> *__return_storage_ptr__,Stringifier *this,unsigned_long_long i)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  uint8_t *puVar3;
  unsigned_long_long u;
  uint8_t reverse [25];
  
  if (i == 0) {
    puVar3 = reverse + 1;
    reverse[0] = '\0';
  }
  else {
    puVar3 = reverse;
    for (; i != 0; i = i / 10) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = i;
      *puVar3 = SUB161(auVar1 % ZEXT816(10),0);
      puVar3 = puVar3 + 1;
    }
  }
  sVar2 = 0;
  for (; reverse < puVar3; puVar3 = puVar3 + -1) {
    __return_storage_ptr__->content[sVar2] = puVar3[-1] + '0';
    sVar2 = sVar2 + 1;
  }
  __return_storage_ptr__->currentSize = sVar2;
  return __return_storage_ptr__;
}

Assistant:

static CappedArray<char, sizeof(T) * 3 + 2> stringifyImpl(T i) {
  // We don't use sprintf() because it's not async-signal-safe (for strPreallocated()).
  CappedArray<char, sizeof(T) * 3 + 2> result;
  bool negative = i < 0;
  Unsigned u = negative ? -i : i;
  uint8_t reverse[sizeof(T) * 3 + 1];
  uint8_t* p = reverse;
  if (u == 0) {
    *p++ = 0;
  } else {
    while (u > 0) {
      *p++ = u % 10;
      u /= 10;
    }
  }

  char* p2 = result.begin();
  if (negative) *p2++ = '-';
  while (p > reverse) {
    *p2++ = '0' + *--p;
  }
  result.setSize(p2 - result.begin());
  return result;
}